

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeMarkTFI_rec(Gia_Man_t *p,int Id,Vec_Bit_t *vMarked)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (-1 < Id) {
    uVar4 = (ulong)(uint)Id;
    do {
      uVar3 = (uint)uVar4;
      if (p->nObjs <= (int)uVar3) break;
      if (vMarked->nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      uVar2 = vMarked->pArray[uVar4 >> 5];
      if ((uVar2 >> (uVar3 & 0x1f) & 1) != 0) {
        return;
      }
      pGVar1 = p->pObjs;
      vMarked->pArray[uVar4 >> 5] = uVar2 | 1 << ((byte)uVar4 & 0x1f);
      uVar2 = (uint)*(undefined8 *)(pGVar1 + uVar4);
      if ((int)uVar2 < 0) {
        return;
      }
      if ((uVar2 & 0x1fffffff) == 0x1fffffff) {
        return;
      }
      Acec_TreeMarkTFI_rec(p,uVar3 - (uVar2 & 0x1fffffff),vMarked);
      uVar3 = uVar3 - (*(uint *)&pGVar1[uVar4].field_0x4 & 0x1fffffff);
      uVar4 = (ulong)uVar3;
    } while (-1 < (int)uVar3);
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Acec_TreeMarkTFI_rec( Gia_Man_t * p, int Id, Vec_Bit_t * vMarked )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, Id);
    if ( Vec_BitEntry(vMarked, Id) )
        return;
    Vec_BitWriteEntry( vMarked, Id, 1 );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Acec_TreeMarkTFI_rec( p, Gia_ObjFaninId0(pObj, Id), vMarked );
    Acec_TreeMarkTFI_rec( p, Gia_ObjFaninId1(pObj, Id), vMarked );
}